

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_grid_mesh.h
# Opt level: O2

PrimInfoMB * __thiscall
embree::avx2::GridMeshISA::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,GridMeshISA *this,mvector<PrimRefMB> *prims,
          mvector<SubGridBuildData> *sgrids,BBox1f *t0t1,range<unsigned_long> *r,size_t k,
          uint geomID)

{
  RawBufferView *pRVar1;
  BBox1f BVar2;
  long lVar3;
  PrimRefMB *pPVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar6;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar8;
  float fVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  Grid *pGVar17;
  int iVar18;
  undefined4 uVar19;
  uint uVar20;
  ulong uVar21;
  int iVar22;
  ulong uVar23;
  size_t sVar24;
  size_t *psVar25;
  int iVar26;
  size_t x;
  ulong uVar27;
  bool bVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar51;
  undefined1 auVar49 [16];
  undefined1 auVar50 [64];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar61;
  undefined1 auVar58 [16];
  float fVar60;
  undefined1 auVar59 [64];
  undefined1 auVar62 [16];
  undefined1 auVar63 [64];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [64];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  size_t local_268;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  size_t local_210;
  ulong local_1a8;
  ulong local_1a0;
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  anon_class_32_4_e9707c6d local_158;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  
  (__return_storage_ptr__->object_range)._begin = 0;
  local_210 = k;
  uVar15 = r->_begin;
  auVar67 = ZEXT464(0x3f800000);
  auVar59 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar34._8_4_ = 0x7f800000;
  auVar34._0_8_ = 0x7f8000007f800000;
  auVar34._12_4_ = 0x7f800000;
  auVar73 = ZEXT1664(auVar34);
  auVar56._8_4_ = 0xff800000;
  auVar56._0_8_ = 0xff800000ff800000;
  auVar56._12_4_ = 0xff800000;
  auVar72 = ZEXT1664(auVar56);
  local_268 = 0;
  auVar50 = ZEXT1664(ZEXT816(0) << 0x40);
  auVar63 = ZEXT1664(auVar56);
  auVar74 = ZEXT1664(auVar34);
  auVar75 = ZEXT1664(auVar56);
  auVar77 = ZEXT1664(auVar34);
  auVar76 = ZEXT1664((undefined1  [16])0x0);
  do {
    if (r->_end <= uVar15) {
      (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
      lower.field_0 = auVar77._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
      upper.field_0 = auVar75._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
      lower.field_0 = auVar74._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
      upper.field_0 = auVar63._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.
      field_0 = auVar73._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.
      field_0 = auVar72._0_16_;
      *(undefined1 (*) [16])&(__return_storage_ptr__->object_range)._end = auVar76._0_16_;
      __return_storage_ptr__->max_num_time_segments = local_268;
      auVar56 = vmovlhps_avx(auVar59._0_16_,auVar67._0_16_);
      (__return_storage_ptr__->max_time_range).lower = (float)(int)auVar56._0_8_;
      (__return_storage_ptr__->max_time_range).upper = (float)(int)((ulong)auVar56._0_8_ >> 0x20);
      (__return_storage_ptr__->time_range).lower = (float)(int)auVar56._8_8_;
      (__return_storage_ptr__->time_range).upper = (float)(int)((ulong)auVar56._8_8_ >> 0x20);
      return __return_storage_ptr__;
    }
    BVar2 = (this->super_GridMesh).super_Geometry.time_range;
    auVar33._8_8_ = 0;
    auVar33._0_4_ = BVar2.lower;
    auVar33._4_4_ = BVar2.upper;
    fVar29 = BVar2.lower;
    auVar56 = vmovshdup_avx(auVar33);
    fVar9 = auVar56._0_4_ - fVar29;
    if (uVar15 < *(ulong *)&(this->super_GridMesh).field_0x70) {
      lVar12 = *(long *)&(this->super_GridMesh).field_0x68 * uVar15;
      lVar3 = *(long *)&(this->super_GridMesh).super_Geometry.field_0x58;
      uVar21 = (this->super_GridMesh).vertices0.super_RawBufferView.num;
      uVar20 = *(uint *)(lVar3 + lVar12);
      if (uVar20 < uVar21) {
        pGVar17 = (Grid *)(lVar3 + lVar12);
        uVar14 = (ulong)pGVar17->resY;
        uVar13 = (ulong)pGVar17->resX;
        if ((pGVar17->lineVtxOffset * (pGVar17->resY - 1) + uVar20 + (uint)pGVar17->resX) - 1 <
            uVar21) {
          fVar32 = (this->super_GridMesh).super_Geometry.fnumTimeSegments;
          auVar56 = ZEXT416((uint)(fVar32 * ((t0t1->lower - fVar29) / fVar9) * 1.0000002));
          auVar56 = vroundss_avx(auVar56,auVar56,9);
          auVar56 = vmaxss_avx(auVar50._0_16_,auVar56);
          auVar34 = ZEXT416((uint)(fVar32 * ((t0t1->upper - fVar29) / fVar9) * 0.99999976));
          auVar34 = vroundss_avx(auVar34,auVar34,10);
          auVar34 = vminss_avx(auVar34,ZEXT416((uint)fVar32));
          for (uVar21 = 0; uVar21 != uVar14; uVar21 = uVar21 + 1) {
            for (uVar27 = 0; uVar27 != uVar13; uVar27 = uVar27 + 1) {
              uVar23 = (long)(int)auVar56._0_4_ - 1;
              psVar25 = &(this->super_GridMesh).vertices.items[(int)auVar56._0_4_].
                         super_RawBufferView.stride;
              while (uVar23 = uVar23 + 1, uVar23 <= (ulong)(long)(int)auVar34._0_4_) {
                pRVar1 = (RawBufferView *)(psVar25 + -2);
                sVar24 = *psVar25;
                psVar25 = psVar25 + 7;
                auVar39._8_4_ = 0xddccb9a2;
                auVar39._0_8_ = 0xddccb9a2ddccb9a2;
                auVar39._12_4_ = 0xddccb9a2;
                auVar33 = vcmpps_avx(*(undefined1 (*) [16])
                                      (pRVar1->ptr_ofs +
                                      sVar24 * (uVar21 * pGVar17->lineVtxOffset + (ulong)uVar20 +
                                               uVar27)),auVar39,6);
                auVar45._8_4_ = 0x5dccb9a2;
                auVar45._0_8_ = 0x5dccb9a25dccb9a2;
                auVar45._12_4_ = 0x5dccb9a2;
                auVar39 = vcmpps_avx(*(undefined1 (*) [16])
                                      (pRVar1->ptr_ofs +
                                      sVar24 * (uVar21 * pGVar17->lineVtxOffset + (ulong)uVar20 +
                                               uVar27)),auVar45,1);
                auVar33 = vandps_avx(auVar33,auVar39);
                uVar19 = vmovmskps_avx(auVar33);
                if ((~(byte)uVar19 & 7) != 0) goto LAB_015019dd;
              }
            }
          }
          uVar21 = 0;
          while (uVar20 = (uint)uVar21, uVar20 < (int)uVar14 - 1U) {
            local_1a0 = 0;
            while( true ) {
              uVar16 = (uint)local_1a0;
              if ((int)uVar13 - 1U <= uVar16) break;
              local_138 = auVar77._0_16_;
              local_128 = auVar76._0_16_;
              local_118 = auVar75._0_16_;
              local_108 = auVar74._0_16_;
              local_f8 = auVar63._0_16_;
              local_e8 = auVar73._0_16_;
              local_d8 = auVar72._0_16_;
              local_c8 = auVar67._0_16_;
              local_b8 = auVar59._0_16_;
              local_158.sx = &local_1a0;
              local_158.sy = &local_1a8;
              fVar9 = (this->super_GridMesh).super_Geometry.fnumTimeSegments;
              fVar29 = (this->super_GridMesh).super_Geometry.time_range.lower;
              fVar30 = (this->super_GridMesh).super_Geometry.time_range.upper - fVar29;
              fVar38 = (t0t1->lower - fVar29) / fVar30;
              fVar30 = (t0t1->upper - fVar29) / fVar30;
              fVar29 = fVar9 * fVar38;
              fVar32 = fVar9 * fVar30;
              auVar33 = vroundss_avx(ZEXT416((uint)fVar29),ZEXT416((uint)fVar29),9);
              auVar39 = vroundss_avx(ZEXT416((uint)fVar32),ZEXT416((uint)fVar32),10);
              auVar56 = vmaxss_avx(auVar33,auVar50._0_16_);
              auVar34 = vminss_avx(auVar39,ZEXT416((uint)fVar9));
              iVar18 = (int)auVar56._0_4_;
              fVar44 = auVar34._0_4_;
              iVar22 = (int)auVar33._0_4_;
              iVar26 = -1;
              if (-1 < iVar22) {
                iVar26 = iVar22;
              }
              iVar10 = (int)fVar9 + 1;
              if ((int)auVar39._0_4_ < (int)fVar9 + 1) {
                iVar10 = (int)auVar39._0_4_;
              }
              local_1a8 = uVar21;
              local_158.this = &this->super_GridMesh;
              local_158.g = pGVar17;
              GridMesh::linearBounds::anon_class_32_4_e9707c6d::operator()
                        (&blower0,&local_158,(long)iVar18);
              GridMesh::linearBounds::anon_class_32_4_e9707c6d::operator()
                        (&bupper1,&local_158,(long)(int)fVar44);
              fVar29 = fVar29 - auVar56._0_4_;
              if (iVar10 - iVar26 == 1) {
                auVar56 = vmaxss_avx(ZEXT416((uint)fVar29),ZEXT816(0) << 0x40);
                fVar29 = auVar56._0_4_;
                fVar9 = 1.0 - fVar29;
                auVar64._0_4_ = fVar29 * bupper1.lower.field_0._0_4_;
                auVar64._4_4_ = fVar29 * bupper1.lower.field_0._4_4_;
                auVar64._8_4_ = fVar29 * bupper1.lower.field_0._8_4_;
                auVar64._12_4_ = fVar29 * bupper1.lower.field_0._12_4_;
                auVar40._4_4_ = fVar9;
                auVar40._0_4_ = fVar9;
                auVar40._8_4_ = fVar9;
                auVar40._12_4_ = fVar9;
                auVar66 = vfmadd231ps_fma(auVar64,auVar40,(undefined1  [16])blower0.lower.field_0);
                auVar68._0_4_ = fVar29 * bupper1.upper.field_0._0_4_;
                auVar68._4_4_ = fVar29 * bupper1.upper.field_0._4_4_;
                auVar68._8_4_ = fVar29 * bupper1.upper.field_0._8_4_;
                auVar68._12_4_ = fVar29 * bupper1.upper.field_0._12_4_;
                auVar71 = vfmadd231ps_fma(auVar68,(undefined1  [16])blower0.upper.field_0,auVar40);
                auVar56 = vmaxss_avx(ZEXT416((uint)(fVar44 - fVar32)),ZEXT816(0) << 0x40);
                fVar29 = auVar56._0_4_;
                fVar9 = 1.0 - fVar29;
                auVar47._0_4_ = fVar29 * blower0.lower.field_0._0_4_;
                auVar47._4_4_ = fVar29 * blower0.lower.field_0._4_4_;
                auVar47._8_4_ = fVar29 * blower0.lower.field_0._8_4_;
                auVar47._12_4_ = fVar29 * blower0.lower.field_0._12_4_;
                auVar41._4_4_ = fVar9;
                auVar41._0_4_ = fVar9;
                auVar41._8_4_ = fVar9;
                auVar41._12_4_ = fVar9;
                auVar49 = vfmadd231ps_fma(auVar47,auVar41,(undefined1  [16])bupper1.lower.field_0);
                auVar52._0_4_ = fVar29 * blower0.upper.field_0._0_4_;
                auVar52._4_4_ = fVar29 * blower0.upper.field_0._4_4_;
                auVar52._8_4_ = fVar29 * blower0.upper.field_0._8_4_;
                auVar52._12_4_ = fVar29 * blower0.upper.field_0._12_4_;
                auVar58 = vfmadd231ps_fma(auVar52,auVar41,(undefined1  [16])bupper1.upper.field_0);
              }
              else {
                GridMesh::linearBounds::anon_class_32_4_e9707c6d::operator()
                          (&blower1,&local_158,(long)(iVar18 + 1));
                GridMesh::linearBounds::anon_class_32_4_e9707c6d::operator()
                          (&bupper0,&local_158,(long)((int)fVar44 + -1));
                auVar56 = vmaxss_avx(ZEXT416((uint)fVar29),ZEXT816(0) << 0x40);
                fVar31 = auVar56._0_4_;
                fVar29 = 1.0 - fVar31;
                auVar65._0_4_ = fVar31 * blower1.lower.field_0.m128[0];
                auVar65._4_4_ = fVar31 * blower1.lower.field_0.m128[1];
                auVar65._8_4_ = fVar31 * blower1.lower.field_0.m128[2];
                auVar65._12_4_ = fVar31 * blower1.lower.field_0.m128[3];
                auVar42._4_4_ = fVar29;
                auVar42._0_4_ = fVar29;
                auVar42._8_4_ = fVar29;
                auVar42._12_4_ = fVar29;
                auVar66 = vfmadd231ps_fma(auVar65,auVar42,(undefined1  [16])blower0.lower.field_0);
                auVar70._0_4_ = fVar31 * blower1.upper.field_0.m128[0];
                auVar70._4_4_ = fVar31 * blower1.upper.field_0.m128[1];
                auVar70._8_4_ = fVar31 * blower1.upper.field_0.m128[2];
                auVar70._12_4_ = fVar31 * blower1.upper.field_0.m128[3];
                auVar71 = vfmadd231ps_fma(auVar70,auVar42,(undefined1  [16])blower0.upper.field_0);
                auVar56 = vmaxss_avx(ZEXT416((uint)(fVar44 - fVar32)),ZEXT816(0) << 0x40);
                fVar32 = auVar56._0_4_;
                auVar48._0_4_ = fVar32 * bupper0.lower.field_0.m128[0];
                auVar48._4_4_ = fVar32 * bupper0.lower.field_0.m128[1];
                auVar48._8_4_ = fVar32 * bupper0.lower.field_0.m128[2];
                auVar48._12_4_ = fVar32 * bupper0.lower.field_0.m128[3];
                fVar29 = 1.0 - fVar32;
                auVar36._4_4_ = fVar29;
                auVar36._0_4_ = fVar29;
                auVar36._8_4_ = fVar29;
                auVar36._12_4_ = fVar29;
                auVar49 = vfmadd231ps_fma(auVar48,auVar36,(undefined1  [16])bupper1.lower.field_0);
                auVar57._0_4_ = fVar32 * bupper0.upper.field_0.m128[0];
                auVar57._4_4_ = fVar32 * bupper0.upper.field_0.m128[1];
                auVar57._8_4_ = fVar32 * bupper0.upper.field_0.m128[2];
                auVar57._12_4_ = fVar32 * bupper0.upper.field_0.m128[3];
                auVar58 = vfmadd231ps_fma(auVar57,auVar36,(undefined1  [16])bupper1.upper.field_0);
                if (iVar22 < 0) {
                  iVar22 = -1;
                }
                sVar24 = (size_t)iVar22;
                while (sVar24 = sVar24 + 1, (long)sVar24 < (long)iVar10) {
                  fVar32 = ((float)(int)sVar24 / fVar9 - fVar38) / (fVar30 - fVar38);
                  fVar29 = 1.0 - fVar32;
                  auVar46._0_4_ = auVar49._0_4_ * fVar32;
                  fVar44 = auVar49._4_4_;
                  auVar46._4_4_ = fVar44 * fVar32;
                  fVar31 = auVar49._8_4_;
                  auVar46._8_4_ = fVar31 * fVar32;
                  fVar51 = auVar49._12_4_;
                  auVar46._12_4_ = fVar51 * fVar32;
                  auVar43._4_4_ = fVar29;
                  auVar43._0_4_ = fVar29;
                  auVar43._8_4_ = fVar29;
                  auVar43._12_4_ = fVar29;
                  auVar56 = vfmadd231ps_fma(auVar46,auVar43,auVar66);
                  auVar37._0_4_ = auVar58._0_4_ * fVar32;
                  fVar29 = auVar58._4_4_;
                  auVar37._4_4_ = fVar29 * fVar32;
                  fVar60 = auVar58._8_4_;
                  auVar37._8_4_ = fVar60 * fVar32;
                  fVar61 = auVar58._12_4_;
                  auVar37._12_4_ = fVar61 * fVar32;
                  local_a8 = vfmadd231ps_fma(auVar37,auVar71,auVar43);
                  GridMesh::linearBounds::anon_class_32_4_e9707c6d::operator()
                            (&bi,&local_158,sVar24);
                  local_258 = auVar71._0_4_;
                  fStack_254 = auVar71._4_4_;
                  fStack_250 = auVar71._8_4_;
                  fStack_24c = auVar71._12_4_;
                  local_248 = auVar66._0_4_;
                  fStack_244 = auVar66._4_4_;
                  fStack_240 = auVar66._8_4_;
                  fStack_23c = auVar66._12_4_;
                  auVar56 = vsubps_avx((undefined1  [16])bi.lower.field_0,auVar56);
                  auVar33 = vsubps_avx((undefined1  [16])bi.upper.field_0,local_a8);
                  auVar34 = vminps_avx(auVar56,ZEXT816(0) << 0x40);
                  auVar56 = vmaxps_avx(auVar33,ZEXT816(0) << 0x40);
                  auVar66._0_4_ = local_248 + auVar34._0_4_;
                  auVar66._4_4_ = fStack_244 + auVar34._4_4_;
                  auVar66._8_4_ = fStack_240 + auVar34._8_4_;
                  auVar66._12_4_ = fStack_23c + auVar34._12_4_;
                  auVar49._0_4_ = auVar49._0_4_ + auVar34._0_4_;
                  auVar49._4_4_ = fVar44 + auVar34._4_4_;
                  auVar49._8_4_ = fVar31 + auVar34._8_4_;
                  auVar49._12_4_ = fVar51 + auVar34._12_4_;
                  auVar71._0_4_ = local_258 + auVar56._0_4_;
                  auVar71._4_4_ = fStack_254 + auVar56._4_4_;
                  auVar71._8_4_ = fStack_250 + auVar56._8_4_;
                  auVar71._12_4_ = fStack_24c + auVar56._12_4_;
                  auVar58._0_4_ = auVar58._0_4_ + auVar56._0_4_;
                  auVar58._4_4_ = fVar29 + auVar56._4_4_;
                  auVar58._8_4_ = fVar60 + auVar56._8_4_;
                  auVar58._12_4_ = fVar61 + auVar56._12_4_;
                }
              }
              aVar5 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
                      vinsertps_avx(auVar66,ZEXT416(geomID),0x30);
              uVar11 = (this->super_GridMesh).super_Geometry.numTimeSteps - 1;
              uVar13 = (ulong)uVar11;
              BVar2 = (this->super_GridMesh).super_Geometry.time_range;
              auVar35._8_8_ = 0;
              auVar35._0_4_ = BVar2.lower;
              auVar35._4_4_ = BVar2.upper;
              aVar6 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
                      vinsertps_avx(auVar71,ZEXT416((uint)local_210),0x30);
              aVar7 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                      vinsertps_avx(auVar49,ZEXT416(uVar11),0x30);
              aVar8 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                      vinsertps_avx(auVar58,ZEXT416(uVar11),0x30);
              auVar34 = vcmpps_avx(local_c8,auVar35,1);
              auVar33 = vinsertps_avx(local_c8,auVar35,0x50);
              auVar56 = vblendps_avx(auVar35,local_c8,2);
              auVar56 = vblendvps_avx(auVar56,auVar33,auVar34);
              auVar67 = ZEXT1664(auVar56);
              auVar69._8_4_ = 0x3f000000;
              auVar69._0_8_ = 0x3f0000003f000000;
              auVar69._12_4_ = 0x3f000000;
              auVar53._0_4_ = aVar7.x * 0.5;
              auVar53._4_4_ = aVar7.y * 0.5;
              auVar53._8_4_ = aVar7.z * 0.5;
              auVar53._12_4_ = aVar7.field_3.w * 0.5;
              auVar56 = vfmadd231ps_fma(auVar53,(undefined1  [16])aVar5,auVar69);
              auVar62._0_4_ = aVar8.x * 0.5;
              auVar62._4_4_ = aVar8.y * 0.5;
              auVar62._8_4_ = aVar8.z * 0.5;
              auVar62._12_4_ = aVar8.field_3.w * 0.5;
              auVar34 = vfmadd231ps_fma(auVar62,(undefined1  [16])aVar6,auVar69);
              auVar54._0_4_ = auVar56._0_4_ + auVar34._0_4_;
              auVar54._4_4_ = auVar56._4_4_ + auVar34._4_4_;
              auVar54._8_4_ = auVar56._8_4_ + auVar34._8_4_;
              auVar54._12_4_ = auVar56._12_4_ + auVar34._12_4_;
              auVar56 = vminps_avx(local_e8,auVar54);
              auVar73 = ZEXT1664(auVar56);
              auVar56 = vmaxps_avx(local_d8,auVar54);
              auVar72 = ZEXT1664(auVar56);
              auVar56 = vpmovsxbq_avx(ZEXT216(0x101));
              auVar56 = vpinsrq_avx(auVar56,uVar13,1);
              auVar56 = vpaddq_avx(local_128,auVar56);
              auVar76 = ZEXT1664(auVar56);
              bVar28 = local_268 < uVar13;
              auVar55[1] = bVar28;
              auVar55[0] = bVar28;
              auVar55[2] = bVar28;
              auVar55[3] = bVar28;
              auVar55[4] = bVar28;
              auVar55[5] = bVar28;
              auVar55[6] = bVar28;
              auVar55[7] = bVar28;
              auVar55[8] = bVar28;
              auVar55[9] = bVar28;
              auVar55[10] = bVar28;
              auVar55[0xb] = bVar28;
              auVar55[0xc] = bVar28;
              auVar55[0xd] = bVar28;
              auVar55[0xe] = bVar28;
              auVar55[0xf] = bVar28;
              auVar56 = vpslld_avx(auVar55,0x1f);
              auVar56 = vblendvps_avx(local_b8,auVar35,auVar56);
              auVar59 = ZEXT1664(auVar56);
              auVar56 = vminps_avx(local_138,(undefined1  [16])aVar5);
              auVar77 = ZEXT1664(auVar56);
              if (local_268 <= uVar13) {
                local_268 = uVar13;
              }
              sgrids->items[local_210] =
                   (SubGridBuildData)
                   ((ulong)(uVar16 & 0xfffe | (uint)((uint)pGVar17->resX <= uVar16 + 2) << 0xf) |
                   (ulong)(uVar20 << 0x10 | (uint)((uint)pGVar17->resY <= uVar20 + 2) << 0x1f) |
                   uVar15 << 0x20);
              pPVar4 = prims->items;
              pPVar4[local_210].lbounds.bounds0.lower.field_0 = aVar5;
              auVar56 = vmaxps_avx(local_118,(undefined1  [16])aVar6);
              auVar75 = ZEXT1664(auVar56);
              pPVar4[local_210].lbounds.bounds0.upper.field_0 = aVar6;
              auVar56 = vminps_avx(local_108,(undefined1  [16])aVar7);
              auVar74 = ZEXT1664(auVar56);
              pPVar4[local_210].lbounds.bounds1.lower.field_0.field_1 = aVar7;
              auVar56 = vmaxps_avx(local_f8,(undefined1  [16])aVar8);
              auVar63 = ZEXT1664(auVar56);
              pPVar4[local_210].lbounds.bounds1.upper.field_0.field_1 = aVar8;
              pPVar4[local_210].time_range = BVar2;
              local_210 = local_210 + 1;
              uVar13 = (ulong)pGVar17->resX;
              local_1a0 = (ulong)(uVar16 + 2);
              auVar50 = ZEXT864(0) << 0x20;
            }
            uVar14 = (ulong)pGVar17->resY;
            uVar21 = (ulong)(uVar20 + 2);
          }
        }
      }
    }
LAB_015019dd:
    uVar15 = uVar15 + 1;
  } while( true );
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims, mvector<SubGridBuildData>& sgrids, const BBox1f& t0t1, const range<size_t>& r, size_t k, unsigned int geomID) const override
      {
        PrimInfoMB pinfoMB(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(j, timeSegmentRange(t0t1))) continue;
          const GridMesh::Grid &g = grid(j);
          
          for (unsigned int y=0; y<g.resY-1u; y+=2)
          {
            for (unsigned int x=0; x<g.resX-1u; x+=2)
            {
              const PrimRefMB prim(linearBounds(g,x,y,t0t1),numTimeSegments(),time_range,numTimeSegments(),unsigned(geomID),unsigned(k));
              pinfoMB.add_primref(prim);
              sgrids[k] = SubGridBuildData(x | g.get3x3FlagsX(x), y | g.get3x3FlagsY(y), unsigned(j));
              prims[k++] = prim;
            }
          }
        }
        return pinfoMB;
      }